

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

void __thiscall rengine::WorkQueue::WorkQueue(WorkQueue *this)

{
  WorkQueue *local_28;
  code *local_20;
  undefined8 local_18;
  WorkQueue *local_10;
  WorkQueue *this_local;
  
  local_20 = run;
  local_18 = 0;
  local_28 = this;
  local_10 = this;
  std::thread::thread<void(rengine::WorkQueue::*)(),rengine::WorkQueue*,void>
            (&this->m_thread,(type *)&local_20,&local_28);
  std::mutex::mutex(&this->m_mutex);
  std::condition_variable::condition_variable(&this->m_condition);
  std::__cxx11::
  list<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ::list(&this->m_jobs);
  this->m_running = true;
  return;
}

Assistant:

inline WorkQueue::WorkQueue()
    : m_thread(&WorkQueue::run, this)
{
}